

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O1

gnode_t * local_store_declaration
                    (gravity_parser_t *parser,char *identifier,char *annotation_type,
                    gtoken_t access_specifier,gtoken_t storage_specifier,gnode_t *declaration)

{
  size_t sVar1;
  gnode_r *declarations;
  gnode_variable_decl_t *vdecl;
  char *identifier_00;
  gnode_t *pgVar2;
  gnode_t **ppgVar3;
  size_t sVar4;
  
  declarations = gnode_array_create();
  sVar1 = parser->declarations->n;
  if (sVar1 == 0) {
    pgVar2 = (gnode_t *)0x0;
  }
  else {
    pgVar2 = parser->declarations->p[sVar1 - 1];
  }
  vdecl = (gnode_variable_decl_t *)
          gnode_variable_decl_create
                    (declaration->token,TOK_KEY_VAR,access_specifier,storage_specifier,declarations,
                     pgVar2);
  if (identifier == (char *)0x0) {
    identifier_00 = (char *)0x0;
  }
  else {
    identifier_00 = string_dup(identifier);
  }
  sVar1 = parser->declarations->n;
  if (sVar1 == 0) {
    pgVar2 = (gnode_t *)0x0;
  }
  else {
    pgVar2 = parser->declarations->p[sVar1 - 1];
  }
  pgVar2 = gnode_variable_create
                     (declaration->token,identifier_00,annotation_type,declaration,pgVar2,vdecl);
  sVar1 = declarations->m;
  if (declarations->n == sVar1) {
    sVar4 = 8;
    if (sVar1 != 0) {
      sVar4 = sVar1 * 2;
    }
    declarations->m = sVar4;
    ppgVar3 = (gnode_t **)realloc(declarations->p,sVar4 << 3);
    declarations->p = ppgVar3;
  }
  sVar1 = declarations->n;
  declarations->n = sVar1 + 1;
  declarations->p[sVar1] = pgVar2;
  return &vdecl->base;
}

Assistant:

static gnode_t *local_store_declaration (gravity_parser_t *parser, const char *identifier, const char *annotation_type, gtoken_t access_specifier, gtoken_t storage_specifier, gnode_t *declaration) {
    gnode_r *decls = gnode_array_create();
    
    gnode_variable_decl_t *vdecl = (gnode_variable_decl_t *)gnode_variable_decl_create(declaration->token, TOK_KEY_VAR, access_specifier, storage_specifier, decls, LAST_DECLARATION());
    gnode_t *decl = gnode_variable_create(declaration->token, identifier ? string_dup(identifier) : NULL, annotation_type, declaration, LAST_DECLARATION(), vdecl);
    gnode_array_push(decls, decl);
    
    return (gnode_t *)vdecl;
}